

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

void __thiscall fmt::v5::internal::fp::normalize<0>(fp *this)

{
  int offset;
  uint64_t shifted_implicit_bit;
  fp *this_local;
  
  while ((this->f & 0x10000000000000) == 0) {
    this->f = this->f << 1;
    this->e = this->e + -1;
  }
  this->f = this->f << 0xb;
  this->e = this->e + -0xb;
  return;
}

Assistant:

void normalize() {
    // Handle subnormals.
    auto shifted_implicit_bit = implicit_bit << SHIFT;
    while ((f & shifted_implicit_bit) == 0) {
      f <<= 1;
      --e;
    }
    // Subtract 1 to account for hidden bit.
    auto offset = significand_size - double_significand_size - SHIFT - 1;
    f <<= offset;
    e -= offset;
  }